

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O0

void __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::reserve(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *this,size_type non_zeros,bool preserve)

{
  byte bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  byte in_DL;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  sVar2 = restrict_capacity(in_RSI,CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff);
  *(size_type *)(in_RDI + 8) = sVar2;
  if ((bVar1 & 1) == 0) {
    unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_RDI,in_stack_ffffffffffffffd8);
    unbounded_array<double,_std::allocator<double>_>::resize
              ((unbounded_array<double,_std::allocator<double>_> *)in_RDI,in_stack_ffffffffffffffd8)
    ;
    *(undefined8 *)((unbounded_array<double,_std::allocator<double>_> *)in_RDI + 0x10) = 0;
  }
  else {
    unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_RDI,in_stack_ffffffffffffffd8,0x1287b6);
    unbounded_array<double,_std::allocator<double>_>::resize
              ((unbounded_array<double,_std::allocator<double>_> *)in_RDI,in_stack_ffffffffffffffd8,
               6.00000731294297e-318);
    puVar3 = std::min<unsigned_long>
                       ((unsigned_long *)
                        ((unbounded_array<double,_std::allocator<double>_> *)in_RDI + 8),
                        (unsigned_long *)
                        ((unbounded_array<double,_std::allocator<double>_> *)in_RDI + 0x10));
    *(unsigned_long *)((unbounded_array<double,_std::allocator<double>_> *)in_RDI + 0x10) = *puVar3;
  }
  storage_invariants((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      *)in_RDI);
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        void reserve (size_type non_zeros, bool preserve = true) {
            capacity_ = restrict_capacity (non_zeros);
            if (preserve) {
                index_data_. resize (capacity_, size_type ());
                value_data_. resize (capacity_, value_type ());
                filled_ = (std::min) (capacity_, filled_);
            }
            else {
                index_data_. resize (capacity_);
                value_data_. resize (capacity_);
                filled_ = 0;
            }
            storage_invariants ();
        }